

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O3

int nn_excl_send(nn_excl *self,nn_msg *msg)

{
  uint uVar1;
  ulong uVar2;
  
  if (self->outpipe == (nn_pipe *)0x0) {
    uVar1 = 0xfffffff5;
  }
  else {
    uVar1 = nn_pipe_send(self->outpipe,msg);
    if ((int)uVar1 < 0) {
      uVar2 = (ulong)uVar1;
      nn_excl_send_cold_1();
      if (*(nn_pipe **)(uVar2 + 8) == (nn_pipe *)0x0) {
        uVar1 = 0xfffffff5;
      }
      else {
        uVar1 = nn_pipe_recv(*(nn_pipe **)(uVar2 + 8),msg);
        if ((int)uVar1 < 0) {
          uVar2 = (ulong)uVar1;
          nn_excl_recv_cold_1();
          return (int)(*(long *)(uVar2 + 0x10) != 0);
        }
        if ((uVar1 & 1) != 0) {
          *(undefined8 *)(uVar2 + 8) = 0;
        }
        uVar1 = uVar1 & 0x7ffffffe;
      }
      return uVar1;
    }
    if ((uVar1 & 1) != 0) {
      self->outpipe = (nn_pipe *)0x0;
    }
    uVar1 = uVar1 & 0x7ffffffe;
  }
  return uVar1;
}

Assistant:

int nn_excl_send (struct nn_excl *self, struct nn_msg *msg)
{
    int rc;

    if (nn_slow (!self->outpipe))
        return -EAGAIN;

    rc = nn_pipe_send (self->outpipe, msg);
    errnum_assert (rc >= 0, -rc);

    if (rc & NN_PIPE_RELEASE)
        self->outpipe = NULL;

    return rc & ~NN_PIPE_RELEASE;
}